

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

GLFWcursor * glfwCreateStandardCursor(int shape)

{
  int iVar1;
  uint in_EDI;
  _GLFWcursor *cursor;
  int in_stack_00000014;
  _GLFWcursor *in_stack_00000018;
  _GLFWcursor *local_8;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    local_8 = (_GLFWcursor *)0x0;
  }
  else if ((((((in_EDI == 0x36001) || (in_EDI == 0x36002)) || (in_EDI == 0x36003)) ||
            ((in_EDI == 0x36004 || (in_EDI == 0x36005)))) ||
           ((in_EDI == 0x36006 || ((in_EDI == 0x36007 || (in_EDI == 0x36008)))))) ||
          ((in_EDI == 0x36009 || (in_EDI == 0x3600a)))) {
    local_8 = (_GLFWcursor *)calloc(1,0x10);
    local_8->next = _glfw.cursorListHead;
    _glfw.cursorListHead = local_8;
    iVar1 = _glfwPlatformCreateStandardCursor(in_stack_00000018,in_stack_00000014);
    if (iVar1 == 0) {
      glfwDestroyCursor((GLFWcursor *)cursor);
      local_8 = (_GLFWcursor *)0x0;
    }
  }
  else {
    _glfwInputError(0x10003,"Invalid standard cursor 0x%08X",(ulong)in_EDI);
    local_8 = (_GLFWcursor *)0x0;
  }
  return (GLFWcursor *)local_8;
}

Assistant:

GLFWAPI GLFWcursor* glfwCreateStandardCursor(int shape)
{
    _GLFWcursor* cursor;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (shape != GLFW_ARROW_CURSOR &&
        shape != GLFW_IBEAM_CURSOR &&
        shape != GLFW_CROSSHAIR_CURSOR &&
        shape != GLFW_POINTING_HAND_CURSOR &&
        shape != GLFW_RESIZE_EW_CURSOR &&
        shape != GLFW_RESIZE_NS_CURSOR &&
        shape != GLFW_RESIZE_NWSE_CURSOR &&
        shape != GLFW_RESIZE_NESW_CURSOR &&
        shape != GLFW_RESIZE_ALL_CURSOR &&
        shape != GLFW_NOT_ALLOWED_CURSOR)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid standard cursor 0x%08X", shape);
        return NULL;
    }

    cursor = calloc(1, sizeof(_GLFWcursor));
    cursor->next = _glfw.cursorListHead;
    _glfw.cursorListHead = cursor;

    if (!_glfwPlatformCreateStandardCursor(cursor, shape))
    {
        glfwDestroyCursor((GLFWcursor*) cursor);
        return NULL;
    }

    return (GLFWcursor*) cursor;
}